

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMRangeImpl::DOMRangeImpl(DOMRangeImpl *this,DOMDocument *doc,MemoryManager *manager)

{
  DOMNode *local_48;
  DOMNode *local_28;
  MemoryManager *manager_local;
  DOMDocument *doc_local;
  DOMRangeImpl *this_local;
  
  DOMRange::DOMRange(&this->super_DOMRange);
  (this->super_DOMRange)._vptr_DOMRange = (_func_int **)&PTR__DOMRangeImpl_0052c028;
  local_28 = (DOMNode *)0x0;
  if (doc != (DOMDocument *)0x0) {
    local_28 = &doc->super_DOMNode;
  }
  this->fStartContainer = local_28;
  this->fStartOffset = 0;
  local_48 = (DOMNode *)0x0;
  if (doc != (DOMDocument *)0x0) {
    local_48 = &doc->super_DOMNode;
  }
  this->fEndContainer = local_48;
  this->fEndOffset = 0;
  this->fCollapsed = true;
  this->fDocument = doc;
  this->fDetached = false;
  this->fRemoveChild = (DOMNode *)0x0;
  this->fMemoryManager = manager;
  return;
}

Assistant:

DOMRangeImpl::DOMRangeImpl(DOMDocument* doc, MemoryManager* const manager)

    :   fStartContainer(doc),     
        fStartOffset(0),
        fEndContainer(doc),
        fEndOffset(0),        
        fCollapsed(true),
        fDocument(doc),   
        fDetached(false),
        fRemoveChild(0),
        fMemoryManager(manager)
{
}